

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwtUtil.c
# Opt level: O1

int Rwt_ManNodeVolume(Rwt_Man_t *p,Rwt_Node_t *p0,Rwt_Node_t *p1)

{
  uint uVar1;
  void **ppvVar2;
  long lVar3;
  long lVar4;
  int Volume;
  int local_1c;
  
  local_1c = 0;
  uVar1 = p->nTravIds;
  p->nTravIds = uVar1 + 1;
  if (0x8ffffffe < uVar1) {
    lVar3 = (long)p->vForest->nSize;
    if (0 < lVar3) {
      ppvVar2 = p->vForest->pArray;
      lVar4 = 0;
      do {
        *(undefined4 *)((long)ppvVar2[lVar4] + 4) = 0;
        lVar4 = lVar4 + 1;
      } while (lVar3 != lVar4);
    }
    p->nTravIds = 1;
  }
  Rwt_Trav_rec(p,p0,&local_1c);
  Rwt_Trav_rec(p,p1,&local_1c);
  return local_1c;
}

Assistant:

int Rwt_ManNodeVolume( Rwt_Man_t * p, Rwt_Node_t * p0, Rwt_Node_t * p1 )
{
    int Volume = 0;
    Rwt_ManIncTravId( p );
    Rwt_Trav_rec( p, p0, &Volume );
    Rwt_Trav_rec( p, p1, &Volume );
    return Volume;
}